

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_PrintMapKeysTest_Test::TestBody
          (MessageDifferencerTest_PrintMapKeysTest_Test *this)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  values;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  values_00;
  bool bVar1;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *pMVar2;
  char *pcVar3;
  char *in_R9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_628;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_600;
  AssertHelper local_5e8;
  Message local_5e0;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_5a8;
  Message local_5a0;
  bool local_591;
  undefined1 local_590 [8];
  AssertionResult gtest_ar__1;
  string diff_with_any;
  Any any2;
  Any any1;
  Message local_508;
  undefined1 local_500 [8];
  AssertionResult gtest_ar;
  AssertHelper local_4d0;
  Message local_4c8;
  bool local_4b9;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_;
  string diff;
  MessageDifferencer differencer;
  int local_2d0 [2];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_2c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_2c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_298;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_270;
  iterator local_248;
  size_type local_240;
  int local_234;
  int local_230;
  int local_22c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_228;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_220;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_1f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_1d0;
  iterator local_1a8;
  size_type local_1a0;
  undefined1 local_198 [8];
  Item *item;
  undefined1 local_180 [8];
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencerTest_PrintMapKeysTest_Test *this_local;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_180);
  local_198 = (undefined1  [8])
              proto2_unittest::TestDiffMessage::add_item
                        ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  pMVar2 = proto2_unittest::TestDiffMessage_Item::mutable_mp_abi_cxx11_
                     ((TestDiffMessage_Item *)local_198);
  local_228 = &local_220;
  local_22c = 1;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[6],_int,_true>(local_228,(char (*) [6])"key_a",&local_22c);
  local_228 = &local_1f8;
  local_230 = 2;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[6],_int,_true>(local_228,(char (*) [6])"key_b",&local_230);
  local_228 = &local_1d0;
  local_234 = 3;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[6],_int,_true>(local_228,(char (*) [6])"key_c",&local_234);
  local_1a8 = &local_220;
  local_1a0 = 3;
  values_00._M_len = 3;
  values_00._M_array = local_1a8;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::insert
            (pMVar2,values_00);
  local_600 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
               *)&local_1a8;
  do {
    local_600 = local_600 + -1;
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair(local_600);
  } while (local_600 != &local_220);
  local_198 = (undefined1  [8])
              proto2_unittest::TestDiffMessage::add_item((TestDiffMessage *)local_180);
  pMVar2 = proto2_unittest::TestDiffMessage_Item::mutable_mp_abi_cxx11_
                     ((TestDiffMessage_Item *)local_198);
  local_2c8 = &local_2c0;
  local_2d0[1] = 1;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[6],_int,_true>(local_2c8,(char (*) [6])"key_a",local_2d0 + 1);
  local_2c8 = &local_298;
  local_2d0[0] = 3;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[6],_int,_true>(local_2c8,(char (*) [6])"key_b",local_2d0);
  local_2c8 = &local_270;
  differencer.unpack_any_field_.dynamic_message_factory_._M_t.
  super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl._4_4_ = 4;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[6],_int,_true>
            (local_2c8,(char (*) [6])"key_d",
             (int *)((long)&differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                            super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                    + 4));
  local_248 = &local_2c0;
  local_240 = 3;
  values._M_len = 3;
  values._M_array = local_248;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::insert
            (pMVar2,values);
  local_628 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
               *)&local_248;
  do {
    local_628 = local_628 + -1;
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair(local_628);
  } while (local_628 != &local_2c0);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)((long)&diff.field_2 + 8));
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  util::MessageDifferencer::ReportDifferencesToString
            ((MessageDifferencer *)((long)&diff.field_2 + 8),(string *)&gtest_ar_.message_);
  bVar1 = util::MessageDifferencer::Compare
                    ((MessageDifferencer *)((long)&diff.field_2 + 8),
                     (Message *)((long)&msg2.field_0 + 0xa0),(Message *)local_180);
  local_4b9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4b8,&local_4b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_4b8,(AssertionResult *)0x1ebd035,
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x92e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper(&local_4d0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  testing::internal::EqHelper::
  Compare<char[95],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_500,
             "\"modified: item[0].mp[key_b]: 2 -> 3\\n\" \"added: item[0].mp[key_d]: 4\\n\" \"deleted: item[0].mp[key_c]: 3\\n\""
             ,"diff",(char (*) [95])
                     "modified: item[0].mp[key_b]: 2 -> 3\nadded: item[0].mp[key_d]: 4\ndeleted: item[0].mp[key_c]: 3\n"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &gtest_ar_.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_508);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&any1.field_0._impl_.value_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x933,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&any1.field_0._impl_.value_,&local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&any1.field_0._impl_.value_);
    testing::Message::~Message(&local_508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  Any::Any((Any *)&any2.field_0._impl_.value_);
  Any::Any((Any *)((long)&diff_with_any.field_2 + 8));
  Any::PackFrom((Any *)&any2.field_0._impl_.value_,(Message *)((long)&msg2.field_0 + 0xa0));
  Any::PackFrom((Any *)((long)&diff_with_any.field_2 + 8),(Message *)local_180);
  std::__cxx11::string::string((string *)&gtest_ar__1.message_);
  util::MessageDifferencer::ReportDifferencesToString
            ((MessageDifferencer *)((long)&diff.field_2 + 8),(string *)&gtest_ar__1.message_);
  bVar1 = util::MessageDifferencer::Compare
                    ((MessageDifferencer *)((long)&diff.field_2 + 8),
                     (Message *)&any2.field_0._impl_.value_,
                     (Message *)((long)&diff_with_any.field_2 + 8));
  local_591 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_590,&local_591,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
  if (!bVar1) {
    testing::Message::Message(&local_5a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_590,
               (AssertionResult *)"differencer.Compare(any1, any2)","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x93a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5a8,&local_5a0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_5a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
  testing::internal::EqHelper::
  Compare<char[95],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_5d8,
             "\"modified: item[0].mp[key_b]: 2 -> 3\\n\" \"added: item[0].mp[key_d]: 4\\n\" \"deleted: item[0].mp[key_c]: 3\\n\""
             ,"diff_with_any",
             (char (*) [95])
             "modified: item[0].mp[key_b]: 2 -> 3\nadded: item[0].mp[key_d]: 4\ndeleted: item[0].mp[key_c]: 3\n"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &gtest_ar__1.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
  if (!bVar1) {
    testing::Message::Message(&local_5e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x93f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5e8,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper(&local_5e8);
    testing::Message::~Message(&local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
  std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
  Any::~Any((Any *)((long)&diff_with_any.field_2 + 8));
  Any::~Any((Any *)&any2.field_0._impl_.value_);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)((long)&diff.field_2 + 8));
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_180);
  proto2_unittest::TestDiffMessage::~TestDiffMessage
            ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  return;
}

Assistant:

TEST(MessageDifferencerTest, PrintMapKeysTest) {
  // Note that because map is unordered, the comparison
  // output string for test evaluation cannot assume order of
  // output of fields (IOW if two fields are deleted
  // one cannot assume which deleted field log will be printed first).
  // Test currently just has a single record per operation to address this.
  // This should only be a limitation for EXPECT_EQ evaluation.
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  proto2_unittest::TestDiffMessage::Item* item = msg1.add_item();
  item->mutable_mp()->insert({{"key_a", 1}, {"key_b", 2}, {"key_c", 3}});
  item = msg2.add_item();
  item->mutable_mp()->insert({{"key_a", 1}, {"key_b", 3}, {"key_d", 4}});

  util::MessageDifferencer differencer;
  std::string diff;
  differencer.ReportDifferencesToString(&diff);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "modified: item[0].mp[key_b]: 2 -> 3\n"
      "added: item[0].mp[key_d]: 4\n"
      "deleted: item[0].mp[key_c]: 3\n",
      diff);

  google::protobuf::Any any1, any2;
  any1.PackFrom(msg1);
  any2.PackFrom(msg2);
  std::string diff_with_any;
  differencer.ReportDifferencesToString(&diff_with_any);
  EXPECT_FALSE(differencer.Compare(any1, any2));
  EXPECT_EQ(
      "modified: item[0].mp[key_b]: 2 -> 3\n"
      "added: item[0].mp[key_d]: 4\n"
      "deleted: item[0].mp[key_c]: 3\n",
      diff_with_any);
}